

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O1

DistanceGraph * __thiscall
LinkageUntangler::make_nextselected_linkage
          (DistanceGraph *__return_storage_ptr__,LinkageUntangler *this,int min_links)

{
  SequenceDistanceGraph *_sdg;
  bool bVar1;
  pointer pNVar2;
  ulong uVar3;
  _Alloc_hider _Var4;
  pointer ppVar5;
  DistanceGraph *this_00;
  ulong uVar6;
  ulong n;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  string local_68;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_48;
  
  _sdg = (SequenceDistanceGraph *)**(undefined8 **)this;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unnamed","");
  DistanceGraph::DistanceGraph(__return_storage_ptr__,_sdg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  this_00 = *(DistanceGraph **)this;
  pNVar2 = (this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 3) *
                 0x6db6db6db6db6db7)) {
    n = 1;
    do {
      if ((pNVar2[n].status != Deleted) &&
         ((*(ulong *)(*(long *)(this + 8) + (n >> 6) * 8) >> (n & 0x3f) & 1) != 0)) {
        DistanceGraph::fw_neighbours_by_distance
                  ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)&local_68
                   ,this_00,n,min_links);
        if (local_68._M_dataplus._M_p != (pointer)local_68._M_string_length) {
          _Var4._M_p = local_68._M_dataplus._M_p;
          do {
            uVar3 = *(ulong *)((long)_Var4._M_p + 8);
            uVar6 = -uVar3;
            if (0 < (long)uVar3) {
              uVar6 = uVar3;
            }
            if ((uVar6 != n) &&
               ((*(ulong *)(*(long *)(this + 8) + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
              bVar1 = DistanceGraph::are_connected(__return_storage_ptr__,-n,uVar3);
              if (!bVar1) {
                DistanceGraph::add_link
                          (__return_storage_ptr__,-n,*(sgNodeID_t *)((long)_Var4._M_p + 8),
                           *(int32_t *)_Var4._M_p,(Support)ZEXT816(0));
              }
              break;
            }
            _Var4._M_p = _Var4._M_p + 0x10;
          } while (_Var4._M_p != (pointer)local_68._M_string_length);
        }
        DistanceGraph::fw_neighbours_by_distance(&local_48,*(DistanceGraph **)this,-n,min_links);
        if (local_48.
            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>._M_impl
            .super__Vector_impl_data._M_start !=
            local_48.
            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          ppVar5 = local_48.
                   super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            uVar3 = ppVar5->second;
            uVar6 = -uVar3;
            if (0 < (long)uVar3) {
              uVar6 = uVar3;
            }
            if ((uVar6 != n) &&
               ((*(ulong *)(*(long *)(this + 8) + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
              bVar1 = DistanceGraph::are_connected(__return_storage_ptr__,n,uVar3);
              if (!bVar1) {
                DistanceGraph::add_link
                          (__return_storage_ptr__,n,ppVar5->second,ppVar5->first,(Support)ZEXT816(0)
                          );
              }
              break;
            }
            ppVar5 = ppVar5 + 1;
          } while (ppVar5 != local_48.
                             super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_48.
            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_68._M_dataplus._M_p,
                          local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
        }
      }
      n = n + 1;
      this_00 = *(DistanceGraph **)this;
      pNVar2 = (this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar2 >> 3) * 0x6db6db6db6db6db7;
    } while (n <= uVar3 && uVar3 - n != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

DistanceGraph LinkageUntangler::make_nextselected_linkage(int min_links) {
    DistanceGraph ldg(dg.sdg);
    for (auto n=1;n<dg.sdg.nodes.size();++n) {
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted or !selected_nodes[n]) continue;
        auto fw_sorted = dg.fw_neighbours_by_distance(n, min_links);
        for (auto &fwl:fw_sorted) {
            if (llabs(fwl.second)!=n and selected_nodes[llabs(fwl.second)]) {
                if (!ldg.are_connected(-n, fwl.second)) {
                    ldg.add_link(-n, fwl.second, fwl.first);
                }
                break;
            }
        }
        auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
        for (auto &bwl:bw_sorted) {
            if (llabs(bwl.second)!=n and selected_nodes[llabs(bwl.second)]) {
                if (!ldg.are_connected(n, bwl.second)) {
                    ldg.add_link(n, bwl.second, bwl.first);
                }
                break;
            }
        }
    }
    return ldg;
}